

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

bool __thiscall
Js::JavascriptRegExp::SetPropertyBuiltIns
          (JavascriptRegExp *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          BOOL *result)

{
  char cVar1;
  ScriptContext *scriptContext;
  bool bVar2;
  ThreadConfiguration *pTVar3;
  BOOL BVar4;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  bVar2 = false;
  switch(propertyId) {
  case 0x1a1:
    goto switchD_00d0826a_caseD_1a1;
  case 0x1a2:
    Memory::Recycler::WBSetBit((char *)&this->lastIndexVar);
    (this->lastIndexVar).ptr = value;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastIndexVar);
    this->lastIndexOrFlag = 0xfffffffe;
    BVar4 = 1;
    goto LAB_00d082c0;
  case 0x1a4:
    pTVar3 = (scriptContext->config).threadConfig;
    cVar1 = pTVar3->m_ES2018RegExDotAll;
    break;
  case 0x1a6:
    pTVar3 = (scriptContext->config).threadConfig;
    cVar1 = pTVar3->m_ES6Unicode;
    break;
  case 0x1a7:
    pTVar3 = (scriptContext->config).threadConfig;
    cVar1 = pTVar3->m_ES6RegExSticky;
    break;
  default:
    if ((propertyId != 0x153) && (propertyId != 0x1e0)) {
      return false;
    }
  case 0x1a0:
  case 0x1a3:
  case 0x1a5:
    pTVar3 = (scriptContext->config).threadConfig;
    goto LAB_00d082ab;
  }
  if (cVar1 == '\x01') {
LAB_00d082ab:
    BVar4 = 0;
    bVar2 = false;
    if (pTVar3->m_ES6RegExPrototypeProperties == false) {
      JavascriptError::ThrowCantAssignIfStrictMode(flags,scriptContext);
LAB_00d082c0:
      *result = BVar4;
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
switchD_00d0826a_caseD_1a1:
  return bVar2;
}

Assistant:

bool JavascriptRegExp::SetPropertyBuiltIns(PropertyId propertyId, Var value, PropertyOperationFlags flags, BOOL* result)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define SET_PROPERTY(ownProperty) \
        if (ownProperty) \
        { \
            JavascriptError::ThrowCantAssignIfStrictMode(flags, this->GetScriptContext()); \
            *result = false; \
            return true; \
        } \
        return false;

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            this->lastIndexVar = value;
            lastIndexOrFlag = NotCachedValue;
            *result = true;
            return true;
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            SET_PROPERTY(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            SET_PROPERTY(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::unicode:
            SET_PROPERTY(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::sticky:
            SET_PROPERTY(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        default:
            return false;
        }

#undef SET_PROPERTY
    }